

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::propagate_nonuniform_qualifier(CompilerGLSL *this,uint32_t id)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRExpression *pSVar4;
  SPIRCombinedImageSampler *pSVar5;
  SPIRAccessChain *pSVar6;
  long lVar7;
  
  while( true ) {
    bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationNonUniform);
    if (!bVar3) {
      Compiler::set_decoration(&this->super_Compiler,(ID)id,DecorationNonUniform,0);
      Compiler::force_recompile(&this->super_Compiler);
    }
    pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
    pSVar5 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>(&this->super_Compiler,id);
    pSVar6 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>(&this->super_Compiler,id);
    if (pSVar4 != (SPIRExpression *)0x0) break;
    if (pSVar5 == (SPIRCombinedImageSampler *)0x0) {
      if (pSVar6 != (SPIRAccessChain *)0x0) {
        pTVar1 = (pSVar6->implied_read_expressions).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        sVar2 = (pSVar6->implied_read_expressions).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
        for (lVar7 = 0; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
          propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar1->id + lVar7));
        }
      }
      return;
    }
    propagate_nonuniform_qualifier(this,(pSVar5->image).id);
    id = (pSVar5->sampler).id;
  }
  pTVar1 = (pSVar4->expression_dependencies).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (pSVar4->expression_dependencies).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar7 = 0; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
    propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar1->id + lVar7));
  }
  pTVar1 = (pSVar4->implied_read_expressions).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (pSVar4->implied_read_expressions).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar7 = 0; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
    propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar1->id + lVar7));
  }
  return;
}

Assistant:

void CompilerGLSL::propagate_nonuniform_qualifier(uint32_t id)
{
	// SPIR-V might only tag the very last ID with NonUniformEXT, but for codegen,
	// we need to know NonUniformEXT a little earlier, when the resource is actually loaded.
	// Back-propagate the qualifier based on the expression dependency chain.

	if (!has_decoration(id, DecorationNonUniformEXT))
	{
		set_decoration(id, DecorationNonUniformEXT);
		force_recompile();
	}

	auto *e = maybe_get<SPIRExpression>(id);
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto *chain = maybe_get<SPIRAccessChain>(id);
	if (e)
	{
		for (auto &expr : e->expression_dependencies)
			propagate_nonuniform_qualifier(expr);
		for (auto &expr : e->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
	else if (combined)
	{
		propagate_nonuniform_qualifier(combined->image);
		propagate_nonuniform_qualifier(combined->sampler);
	}
	else if (chain)
	{
		for (auto &expr : chain->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
}